

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Value_Slider.cxx
# Opt level: O1

int __thiscall Fl_Value_Slider::handle(Fl_Value_Slider *this,int event)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  
  if (event == 1) {
    bVar1 = Fl::option(OPTION_VISIBLE_FOCUS);
    if (bVar1) {
      Fl::focus((Fl_Widget *)this);
      Fl_Widget::redraw((Fl_Widget *)this);
    }
  }
  iVar6 = (this->super_Fl_Slider).super_Fl_Valuator.super_Fl_Widget.x_;
  iVar9 = (this->super_Fl_Slider).super_Fl_Valuator.super_Fl_Widget.y_;
  iVar7 = (this->super_Fl_Slider).super_Fl_Valuator.super_Fl_Widget.w_;
  iVar8 = (this->super_Fl_Slider).super_Fl_Valuator.super_Fl_Widget.h_;
  if (((this->super_Fl_Slider).super_Fl_Valuator.super_Fl_Widget.type_ & 1) == 0) {
    iVar9 = iVar9 + 0x19;
    iVar8 = iVar8 + -0x19;
  }
  else {
    iVar6 = iVar6 + 0x23;
    iVar7 = iVar7 + -0x23;
  }
  iVar2 = Fl::box_dx((uint)(this->super_Fl_Slider).super_Fl_Valuator.super_Fl_Widget.box_);
  iVar3 = Fl::box_dy((uint)(this->super_Fl_Slider).super_Fl_Valuator.super_Fl_Widget.box_);
  iVar4 = Fl::box_dw((uint)(this->super_Fl_Slider).super_Fl_Valuator.super_Fl_Widget.box_);
  iVar5 = Fl::box_dh((uint)(this->super_Fl_Slider).super_Fl_Valuator.super_Fl_Widget.box_);
  iVar6 = Fl_Slider::handle(&this->super_Fl_Slider,event,iVar6 + iVar2,iVar9 + iVar3,iVar7 - iVar4,
                            iVar8 - iVar5);
  return iVar6;
}

Assistant:

int Fl_Value_Slider::handle(int event) {
  if (event == FL_PUSH && Fl::visible_focus()) {
    Fl::focus(this);
    redraw();
  }
  int sxx = x(), syy = y(), sww = w(), shh = h();
  if (horizontal()) {
    sxx += 35; sww -= 35;
  } else {
    syy += 25; shh -= 25;
  }
  return Fl_Slider::handle(event,
			   sxx+Fl::box_dx(box()),
			   syy+Fl::box_dy(box()),
			   sww-Fl::box_dw(box()),
			   shh-Fl::box_dh(box()));
}